

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

size_t leb128_len(uchar *p)

{
  size_t ret;
  uchar *p_local;
  
  ret = 1;
  for (p_local = p; (*p_local & 0x80) != 0; p_local = p_local + 1) {
    ret = ret + 1;
  }
  return ret;
}

Assistant:

static size_t
leb128_len (const unsigned char *p)
{
  size_t ret;

  ret = 1;
  while ((*p & 0x80) != 0)
    {
      ++p;
      ++ret;
    }
  return ret;
}